

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

Ssw_Cla_t *
Ssw_ClassesPrepare(Aig_Man_t *pAig,int nFramesK,int fLatchCorr,int fConstCorr,int fOutputCorr,
                  int nMaxLevs,int fVerbose)

{
  byte *pbVar1;
  int *piVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  Ssw_Cla_t *p;
  Vec_Ptr_t *vCands;
  void **ppvVar6;
  Aig_Obj_t **ppAVar7;
  Aig_Man_t *pAVar8;
  long lVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  Aig_Obj_t *pAVar12;
  int iVar13;
  long lVar14;
  Vec_Ptr_t **ppVVar15;
  Ssw_Cla_t *pSVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  timespec local_70;
  long local_60;
  int local_54;
  Ssw_Sml_t *local_50;
  int local_44;
  int local_40;
  uint local_3c;
  long local_38;
  
  local_60 = CONCAT44(local_60._4_4_,fLatchCorr);
  uVar18 = 4;
  if (4 < nFramesK) {
    uVar18 = nFramesK;
  }
  local_40 = nMaxLevs;
  p = Ssw_ClassesStart(pAig);
  p->fConstCorr = fConstCorr;
  local_54 = fConstCorr;
  iVar5 = clock_gettime(3,&local_70);
  if (iVar5 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  pAVar8 = pAig;
  local_50 = Ssw_SmlSimulateSeq(pAig,0,uVar18,2);
  iVar5 = (int)pAVar8;
  if (fVerbose != 0) {
    lVar9 = (ulong)uVar18 * (long)pAig->vObjs->nSize * 8;
    auVar22._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar22._0_8_ = lVar9;
    auVar22._12_4_ = 0x45300000;
    Abc_Print(iVar5,"Allocated %.2f MB to store simulation information.\n",
              ((auVar22._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * 9.5367431640625e-07)
    ;
    Abc_Print(iVar5,"Initial simulation of %d frames with %d words.     ",(ulong)uVar18,2);
    Abc_Print(iVar5,"%s =","Time");
    iVar13 = 3;
    iVar5 = clock_gettime(3,&local_70);
    if (iVar5 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar9 + lVar14) / 1000000.0);
  }
  iVar5 = clock_gettime(3,&local_70);
  if (iVar5 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  p->pManData = local_50;
  p->pFuncNodeHash = Ssw_SmlObjHashWord;
  p->pFuncNodeIsConst = Ssw_SmlObjIsConstWord;
  p->pFuncNodesAreEqual = Ssw_SmlObjsAreEqualWord;
  vCands = (Vec_Ptr_t *)malloc(0x10);
  vCands->nCap = 1000;
  vCands->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  iVar5 = local_40;
  vCands->pArray = ppvVar6;
  pAVar8 = p->pAig;
  pVVar11 = pAVar8->vObjs;
  local_3c = uVar18;
  if (pVVar11->nSize < 1) {
    if (fOutputCorr == 0) {
      iVar13 = 0;
      uVar21 = 1000;
      goto LAB_005e2a2b;
    }
    ppVVar15 = &pAVar8->vObjs;
    vCands->nSize = 0;
    uVar21 = 1000;
  }
  else {
    iVar13 = 0;
    uVar21 = 1000;
    lVar9 = 0;
    iVar20 = (int)local_60;
    local_44 = fOutputCorr;
    local_38 = lVar14;
    do {
      piVar2 = (int *)pVVar11->pArray[lVar9];
      if (piVar2 != (int *)0x0) {
        uVar18 = (uint)*(undefined8 *)(piVar2 + 6);
        if (iVar20 == 0) {
          uVar18 = uVar18 & 7;
          if (((uVar18 == 2) || (uVar18 - 5 < 2)) &&
             ((iVar5 == 0 ||
              ((int)((uint)((ulong)*(undefined8 *)(piVar2 + 6) >> 0x20) & 0xffffff) <= iVar5))))
          goto LAB_005e27c1;
        }
        else if (((uVar18 & 7) == 2) && (pAVar8->nTruePis <= *piVar2)) {
LAB_005e27c1:
          iVar19 = (int)uVar21;
          if (iVar13 == iVar19) {
            if (iVar19 < 0x10) {
              if (vCands->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vCands->pArray,0x80);
              }
              vCands->pArray = ppvVar6;
              vCands->nCap = 0x10;
              uVar21 = 0x10;
            }
            else {
              uVar21 = (ulong)(uint)(iVar19 * 2);
              if (vCands->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(uVar21 * 8);
              }
              else {
                ppvVar6 = (void **)realloc(vCands->pArray,uVar21 * 8);
              }
              vCands->pArray = ppvVar6;
              vCands->nCap = iVar19 * 2;
            }
            iVar20 = (int)local_60;
          }
          else {
            ppvVar6 = vCands->pArray;
          }
          lVar14 = (long)iVar13;
          iVar13 = iVar13 + 1;
          vCands->nSize = iVar13;
          ppvVar6[lVar14] = piVar2;
          pAVar8 = p->pAig;
        }
      }
      lVar9 = lVar9 + 1;
      pVVar11 = pAVar8->vObjs;
      iVar19 = pVVar11->nSize;
    } while (lVar9 < iVar19);
    lVar14 = local_38;
    if (local_44 == 0) goto LAB_005e2a2b;
    ppVVar15 = &pAVar8->vObjs;
    vCands->nSize = 0;
    if (0 < iVar19) {
      lVar9 = 0;
      do {
        if (pVVar11->pArray[lVar9] != (void *)0x0) {
          pbVar1 = (byte *)((long)pVVar11->pArray[lVar9] + 0x18);
          *pbVar1 = *pbVar1 & 0xdf;
          pVVar11 = *ppVVar15;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar11->nSize);
    }
  }
  iVar5 = pAVar8->nTruePos;
  if (0 < iVar5) {
    lVar9 = 0;
    do {
      if (pAVar8->vCos->nSize <= lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar17 = *(ulong *)((long)pAVar8->vCos->pArray[lVar9] + 8) & 0xfffffffffffffffe;
      uVar3 = *(ulong *)(uVar17 + 0x18);
      uVar18 = (uint)uVar3 & 7;
      if ((uVar18 < 7) && ((100U >> uVar18 & 1) != 0)) {
        *(ulong *)(uVar17 + 0x18) = uVar3 | 0x20;
        iVar5 = pAVar8->nTruePos;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
    pVVar11 = *ppVVar15;
  }
  if (pVVar11->nSize < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    lVar9 = 0;
    do {
      pvVar4 = pVVar11->pArray[lVar9];
      if ((pvVar4 != (void *)0x0) && ((*(byte *)((long)pvVar4 + 0x18) & 0x20) != 0)) {
        iVar5 = (int)uVar21;
        if (iVar13 == iVar5) {
          if (iVar5 < 0x10) {
            if (vCands->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vCands->pArray,0x80);
            }
            vCands->pArray = ppvVar6;
            vCands->nCap = 0x10;
            uVar21 = 0x10;
          }
          else {
            uVar21 = (ulong)(uint)(iVar5 * 2);
            if (vCands->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(uVar21 * 8);
            }
            else {
              ppvVar6 = (void **)realloc(vCands->pArray,uVar21 * 8);
            }
            vCands->pArray = ppvVar6;
            vCands->nCap = iVar5 * 2;
          }
        }
        else {
          ppvVar6 = vCands->pArray;
        }
        lVar10 = (long)iVar13;
        iVar13 = iVar13 + 1;
        vCands->nSize = iVar13;
        ppvVar6[lVar10] = pvVar4;
        pAVar8 = p->pAig;
      }
      lVar9 = lVar9 + 1;
      pVVar11 = pAVar8->vObjs;
    } while (lVar9 < pVVar11->nSize);
    if (0 < pVVar11->nSize) {
      lVar9 = 0;
      do {
        if (pVVar11->pArray[lVar9] != (void *)0x0) {
          pbVar1 = (byte *)((long)pVVar11->pArray[lVar9] + 0x18);
          *pbVar1 = *pbVar1 & 0xdf;
          pVVar11 = pAVar8->vObjs;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar11->nSize);
    }
  }
LAB_005e2a2b:
  ppAVar7 = (Aig_Obj_t **)malloc((long)iVar13 << 3);
  p->pMemClasses = ppAVar7;
  p->pMemClassesFree = ppAVar7;
  pSVar16 = p;
  Ssw_ClassesPrepareRehash(p,vCands,local_54);
  iVar5 = (int)pSVar16;
  if (fVerbose != 0) {
    Abc_Print(iVar5,"Collecting candidate equivalence classes.        ");
    Abc_Print(iVar5,"%s =","Time");
    iVar13 = 3;
    iVar5 = clock_gettime(3,&local_70);
    if (iVar5 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar9 + lVar14) / 1000000.0);
  }
  iVar5 = clock_gettime(3,&local_70);
  if (iVar5 < 0) {
    local_60 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_60 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  iVar5 = 1;
  do {
    vCands->nSize = 0;
    pAVar8 = p->pAig;
    pVVar11 = pAVar8->vObjs;
    if (pVVar11->nSize < 1) {
      iVar13 = 0;
    }
    else {
      lVar14 = 0;
      iVar13 = 0;
      do {
        pvVar4 = pVVar11->pArray[lVar14];
        if (pvVar4 != (void *)0x0) {
          if (pAVar8->pReprs == (Aig_Obj_t **)0x0) {
            pAVar12 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar12 = pAVar8->pReprs[*(int *)((long)pvVar4 + 0x24)];
          }
          if (pAVar12 == pAVar8->pConst1) {
            iVar20 = (int)uVar21;
            if (iVar13 == iVar20) {
              if (iVar20 < 0x10) {
                if (vCands->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(vCands->pArray,0x80);
                }
                vCands->pArray = ppvVar6;
                vCands->nCap = 0x10;
                uVar21 = 0x10;
              }
              else {
                uVar21 = (ulong)(uint)(iVar20 * 2);
                if (vCands->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(uVar21 * 8);
                }
                else {
                  ppvVar6 = (void **)realloc(vCands->pArray,uVar21 * 8);
                }
                vCands->pArray = ppvVar6;
                vCands->nCap = iVar20 * 2;
              }
            }
            else {
              ppvVar6 = vCands->pArray;
            }
            lVar9 = (long)iVar13;
            iVar13 = iVar13 + 1;
            vCands->nSize = iVar13;
            ppvVar6[lVar9] = pvVar4;
            pAVar8 = p->pAig;
          }
        }
        lVar14 = lVar14 + 1;
        pVVar11 = pAVar8->vObjs;
      } while (lVar14 < pVVar11->nSize);
    }
    if (iVar13 != p->nCands1) {
      __assert_fail("Vec_PtrSize(vCands) == p->nCands1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x2b4,
                    "Ssw_Cla_t *Ssw_ClassesPrepare(Aig_Man_t *, int, int, int, int, int, int)");
    }
    Ssw_SmlResimulateSeq(local_50);
    iVar13 = Ssw_ClassesPrepareRehash(p,vCands,local_54);
    if (iVar13 == 0) goto LAB_005e2c74;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x10);
  iVar5 = 0x10;
LAB_005e2c74:
  Ssw_SmlStop(local_50);
  uVar18 = local_3c;
  if (vCands->pArray != (void **)0x0) {
    free(vCands->pArray);
  }
  free(vCands);
  iVar13 = (int)vCands;
  if (fVerbose != 0) {
    Abc_Print(iVar13,"Simulation of %d frames with %d words (%2d rounds). ",(ulong)uVar18,2,
              (ulong)(iVar5 - 1));
    Abc_Print(iVar13,"%s =","Time");
    iVar13 = 3;
    iVar5 = clock_gettime(3,&local_70);
    if (iVar5 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar14 + local_60) / 1000000.0);
  }
  Ssw_ClassesCheck(p);
  return p;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepare( Aig_Man_t * pAig, int nFramesK, int fLatchCorr, int fConstCorr, int fOutputCorr, int nMaxLevs, int fVerbose )
{
//    int nFrames =  4;
//    int nWords  =  1;
//    int nIters  = 16;

//    int nFrames = 32;
//    int nWords  =  4;
//    int nIters  =  0;

    int nFrames =  Abc_MaxInt( nFramesK, 4 );
    int nWords  =  2;
    int nIters  = 16;
    Ssw_Cla_t * p;
    Ssw_Sml_t * pSml;
    Vec_Ptr_t * vCands;
    Aig_Obj_t * pObj;
    int i, k, RetValue;
    abctime clk;

    // start the classes
    p = Ssw_ClassesStart( pAig );
    p->fConstCorr = fConstCorr;

    // perform sequential simulation
clk = Abc_Clock();
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
if ( fVerbose )
{
    Abc_Print( 1, "Allocated %.2f MB to store simulation information.\n",
        1.0*(sizeof(unsigned) * Aig_ManObjNumMax(pAig) * nFrames * nWords)/(1<<20) );
    Abc_Print( 1, "Initial simulation of %d frames with %d words.     ", nFrames, nWords );
    ABC_PRT( "Time", Abc_Clock() - clk );
}

    // set comparison procedures
clk = Abc_Clock();
    Ssw_ClassesSetData( p, pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );

    // collect nodes to be considered as candidates
    vCands = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Saig_ObjIsLo(p->pAig, pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level > nMaxLevs )
                continue;
        }
        Vec_PtrPush( vCands, pObj );
    }

    // this change will consider all PO drivers
    if ( fOutputCorr )
    {
        Vec_PtrClear( vCands );
        Aig_ManForEachObj( p->pAig, pObj, i )
            pObj->fMarkB = 0;
        Saig_ManForEachPo( p->pAig, pObj, i )
            if ( Aig_ObjIsCand(Aig_ObjFanin0(pObj)) )
                Aig_ObjFanin0(pObj)->fMarkB = 1;
        Aig_ManForEachObj( p->pAig, pObj, i )
            if ( pObj->fMarkB )
                Vec_PtrPush( vCands, pObj );
        Aig_ManForEachObj( p->pAig, pObj, i )
            pObj->fMarkB = 0;
    }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, Vec_PtrSize(vCands) );
    p->pMemClassesFree = p->pMemClasses;

    // now it is time to refine the classes
    Ssw_ClassesPrepareRehash( p, vCands, fConstCorr );
if ( fVerbose )
{
    Abc_Print( 1, "Collecting candidate equivalence classes.        " );
ABC_PRT( "Time", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // perform iterative refinement using simulation
    for ( i = 1; i < nIters; i++ )
    {
        // collect const1 candidates
        Vec_PtrClear( vCands );
        Aig_ManForEachObj( p->pAig, pObj, k )
            if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
                Vec_PtrPush( vCands, pObj );
        assert( Vec_PtrSize(vCands) == p->nCands1 );
        // perform new round of simulation
        Ssw_SmlResimulateSeq( pSml );
        // check equivalence classes
        RetValue = Ssw_ClassesPrepareRehash( p, vCands, fConstCorr );
        if ( RetValue == 0 )
            break;
    }
    Ssw_SmlStop( pSml );
    Vec_PtrFree( vCands );
if ( fVerbose )
{
    Abc_Print( 1, "Simulation of %d frames with %d words (%2d rounds). ",
        nFrames, nWords, i-1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}
    Ssw_ClassesCheck( p );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}